

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

ClipResult __thiscall Text::clip_position(Text *this,Point position)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ClipResult CVar6;
  Point local_20 [2];
  
  uVar4 = (ulong)position & 0xffffffff;
  puVar1 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (uVar4 < uVar5) {
    if (uVar4 == uVar5 - 1) {
      uVar2 = (uint)(this->content)._M_string_length;
    }
    else {
      uVar2 = puVar1[position.row + 1] - 1;
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        uVar3 = puVar1[position.row + 1] - 2;
        if ((this->content)._M_dataplus._M_p[uVar3] == L'\r') {
          uVar2 = uVar3;
        }
      }
    }
    uVar3 = uVar2 - puVar1[uVar4];
    if (uVar3 < position.column) {
      Point::Point(local_20,position.row,uVar3);
    }
    else {
      uVar2 = puVar1[uVar4] + position.column;
      local_20[0] = position;
    }
  }
  else {
    local_20[0] = extent(this);
    uVar2 = (uint)(this->content)._M_string_length;
  }
  CVar6.offset = uVar2;
  CVar6.position = local_20[0];
  return CVar6;
}

Assistant:

ClipResult Text::clip_position(Point position) const {
  uint32_t row = position.row;
  if (row >= line_offsets.size()) {
    return {extent(), size()};
  } else {
    uint32_t start = line_offsets[row];
    uint32_t end;
    if (row == line_offsets.size() - 1) {
      end = content.size();
    } else {
      end = line_offsets[row + 1] - 1;
      if (end > 0 && content[end - 1] == '\r') {
        end--;
      }
    }
    if (position.column > end - start) {
      return {Point(row, end - start), end};
    } else {
      return {position, start + position.column};
    }
  }
}